

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ami_nvar.cpp
# Opt level: O3

void __thiscall ami_nvar_t::nvar_entry_body_t::~nvar_entry_body_t(nvar_entry_body_t *this)

{
  pointer pcVar1;
  ucs2_string_t *puVar2;
  nvar_extended_attributes_t *pnVar3;
  
  (this->super_kstruct)._vptr_kstruct = (_func_int **)&PTR__nvar_entry_body_t_00184998;
  pcVar1 = (this->m_data)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_data).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->m_invoke_data_start)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_invoke_data_start).field_2) {
    operator_delete(pcVar1);
  }
  puVar2 = (this->m_ucs2_name)._M_t.
           super___uniq_ptr_impl<ami_nvar_t::ucs2_string_t,_std::default_delete<ami_nvar_t::ucs2_string_t>_>
           ._M_t.
           super__Tuple_impl<0UL,_ami_nvar_t::ucs2_string_t_*,_std::default_delete<ami_nvar_t::ucs2_string_t>_>
           .super__Head_base<0UL,_ami_nvar_t::ucs2_string_t_*,_false>._M_head_impl;
  if (puVar2 != (ucs2_string_t *)0x0) {
    (**(code **)((long)(puVar2->super_kstruct)._vptr_kstruct + 8))();
  }
  (this->m_ucs2_name)._M_t.
  super___uniq_ptr_impl<ami_nvar_t::ucs2_string_t,_std::default_delete<ami_nvar_t::ucs2_string_t>_>.
  _M_t.
  super__Tuple_impl<0UL,_ami_nvar_t::ucs2_string_t_*,_std::default_delete<ami_nvar_t::ucs2_string_t>_>
  .super__Head_base<0UL,_ami_nvar_t::ucs2_string_t_*,_false>._M_head_impl = (ucs2_string_t *)0x0;
  pcVar1 = (this->m_ascii_name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_ascii_name).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->m_guid)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_guid).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->m_extended_header_hash)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_extended_header_hash).field_2) {
    operator_delete(pcVar1);
  }
  pnVar3 = (this->m_extended_header_attributes)._M_t.
           super___uniq_ptr_impl<ami_nvar_t::nvar_extended_attributes_t,_std::default_delete<ami_nvar_t::nvar_extended_attributes_t>_>
           ._M_t.
           super__Tuple_impl<0UL,_ami_nvar_t::nvar_extended_attributes_t_*,_std::default_delete<ami_nvar_t::nvar_extended_attributes_t>_>
           .super__Head_base<0UL,_ami_nvar_t::nvar_extended_attributes_t_*,_false>._M_head_impl;
  if (pnVar3 != (nvar_extended_attributes_t *)0x0) {
    (**(code **)((long)(pnVar3->super_kstruct)._vptr_kstruct + 8))();
  }
  (this->m_extended_header_attributes)._M_t.
  super___uniq_ptr_impl<ami_nvar_t::nvar_extended_attributes_t,_std::default_delete<ami_nvar_t::nvar_extended_attributes_t>_>
  ._M_t.
  super__Tuple_impl<0UL,_ami_nvar_t::nvar_extended_attributes_t_*,_std::default_delete<ami_nvar_t::nvar_extended_attributes_t>_>
  .super__Head_base<0UL,_ami_nvar_t::nvar_extended_attributes_t_*,_false>._M_head_impl =
       (nvar_extended_attributes_t *)0x0;
  return;
}

Assistant:

ami_nvar_t::nvar_entry_body_t::~nvar_entry_body_t() {
    _clean_up();
}